

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::rehash
          (SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *this)

{
  uint uVar1;
  TypeBase **ppTVar2;
  int iVar3;
  undefined4 extraout_var;
  TypeBase **ppTVar4;
  TypeBase **item;
  uint i;
  TypeBase **oldData;
  uint oldBucketCount;
  SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *this_local;
  
  uVar1 = this->bucketCount;
  ppTVar2 = this->data;
  this->bucketCount = this->bucketCount << 1;
  if (this->allocator == (Allocator *)0x0) {
    ppTVar4 = (TypeBase **)(*(code *)NULLC::alloc)(((ulong)this->bucketCount & 0x1fffffff) << 3);
    this->data = ppTVar4;
  }
  else {
    iVar3 = (*this->allocator->_vptr_Allocator[2])();
    this->data = (TypeBase **)CONCAT44(extraout_var,iVar3);
  }
  NULLC::fillMemory(this->data,0,(ulong)this->bucketCount << 3);
  this->count = 0;
  for (item._4_4_ = 0; item._4_4_ < uVar1; item._4_4_ = item._4_4_ + 1) {
    if (ppTVar2[item._4_4_] != (TypeBase *)0x0) {
      insert(this,ppTVar2 + item._4_4_);
    }
  }
  if (ppTVar2 != this->storage) {
    if (this->allocator == (Allocator *)0x0) {
      (*(code *)NULLC::dealloc)(ppTVar2);
    }
    else {
      (*this->allocator->_vptr_Allocator[3])(this->allocator,ppTVar2);
    }
  }
  return;
}

Assistant:

void rehash()
	{
		unsigned oldBucketCount = bucketCount;
		Key *oldData = data;

		bucketCount *= 2;

		if(allocator)
			data = (Key*)allocator->alloc(sizeof(Key) * bucketCount);
		else
			data = (Key*)NULLC::alloc(sizeof(Key) * bucketCount);

		NULLC::fillMemory(data, 0, sizeof(Key) * bucketCount);

		count = 0;

		for(unsigned i = 0; i < oldBucketCount; i++)
		{
			Key &item = oldData[i];

			if(item == Key())
				continue;

			insert(item);
		}

		if(oldData != storage)
		{
			if(allocator)
				allocator->dealloc(oldData);
			else
				NULLC::dealloc(oldData);
		}
	}